

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QSpanData::adjustSpanMethods(QSpanData *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Representation RVar5;
  bool bVar6;
  code *pcVar7;
  QRect *in_RDI;
  DrawHelper *drawHelper;
  
  in_RDI[1].x2 = 0;
  in_RDI[1].y2 = 0;
  in_RDI[2].x1 = 0;
  in_RDI[2].y1 = 0;
  in_RDI[2].x2 = 0;
  in_RDI[2].y2 = 0;
  in_RDI[3].x1 = 0;
  in_RDI[3].y1 = 0;
  switch((char)in_RDI[8].x2.m_i) {
  case '\0':
    in_RDI[1].x1 = 0;
    in_RDI[1].y1 = 0;
    break;
  case '\x01':
    uVar1 = *(uint *)(*(long *)in_RDI + 0x10);
    *(ProcessSpans *)(in_RDI + 1) = qDrawHelper[uVar1].blendColor;
    *(BitmapBlitFunc *)&in_RDI[1].x2 = qDrawHelper[uVar1].bitmapBlit;
    *(AlphamapBlitFunc *)(in_RDI + 2) = qDrawHelper[uVar1].alphamapBlit;
    *(AlphaRGBBlitFunc *)&in_RDI[2].x2 = qDrawHelper[uVar1].alphaRGBBlit;
    *(RectFillFunc *)(in_RDI + 3) = qDrawHelper[uVar1].fillRect;
    break;
  case '\x02':
  case '\x03':
  case '\x04':
    *(code **)(in_RDI + 1) = qBlendGradient;
    break;
  case '\x05':
    *(code **)(in_RDI + 1) = qBlendTexture;
    lVar2._0_4_ = in_RDI[10].x2;
    lVar2._4_4_ = in_RDI[10].y2;
    if (lVar2 == 0) {
      in_RDI[1].x1 = 0;
      in_RDI[1].y1 = 0;
    }
  }
  lVar3._0_4_ = in_RDI[1].x1;
  lVar3._4_4_ = in_RDI[1].y1;
  if (lVar3 == 0) {
    in_RDI->x2 = 0;
    in_RDI->y2 = 0;
  }
  else {
    lVar4._0_4_ = in_RDI[8].x1;
    lVar4._4_4_ = in_RDI[8].y1;
    if (lVar4 == 0) {
      RVar5.m_i = in_RDI[1].y1.m_i;
      in_RDI->x2 = (Representation)in_RDI[1].x1.m_i;
      in_RDI->y2 = (Representation)RVar5.m_i;
    }
    else if ((*(byte *)(*(long *)(in_RDI + 8) + 0x48) >> 1 & 1) == 0) {
      *(code **)&in_RDI->x2 = qt_span_fill_clipped;
    }
    else {
      bVar6 = QRect::isEmpty(in_RDI);
      pcVar7 = qt_span_fill_clipRect;
      if (bVar6) {
        pcVar7 = (code *)0x0;
      }
      *(code **)&in_RDI->x2 = pcVar7;
    }
  }
  return;
}

Assistant:

void QSpanData::adjustSpanMethods()
{
    bitmapBlit = nullptr;
    alphamapBlit = nullptr;
    alphaRGBBlit = nullptr;

    fillRect = nullptr;

    switch(type) {
    case None:
        unclipped_blend = nullptr;
        break;
    case Solid: {
        const DrawHelper &drawHelper = qDrawHelper[rasterBuffer->format];
        unclipped_blend = drawHelper.blendColor;
        bitmapBlit = drawHelper.bitmapBlit;
        alphamapBlit = drawHelper.alphamapBlit;
        alphaRGBBlit = drawHelper.alphaRGBBlit;
        fillRect = drawHelper.fillRect;
        break;
    }
    case LinearGradient:
    case RadialGradient:
    case ConicalGradient:
        unclipped_blend = qBlendGradient;
        break;
    case Texture:
        unclipped_blend = qBlendTexture;
        if (!texture.imageData)
            unclipped_blend = nullptr;

        break;
    }
    // setup clipping
    if (!unclipped_blend) {
        blend = nullptr;
    } else if (!clip) {
        blend = unclipped_blend;
    } else if (clip->hasRectClip) {
        blend = clip->clipRect.isEmpty() ? nullptr : qt_span_fill_clipRect;
    } else {
        blend = qt_span_fill_clipped;
    }
}